

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::node_copy_attribute
               (xml_attribute_struct *da,xml_attribute_struct *sa)

{
  xml_allocator *pxVar1;
  xml_allocator *alloc;
  
  pxVar1 = *(xml_allocator **)((long)da - (da->header >> 8));
  alloc = (xml_allocator *)0x0;
  if (pxVar1 == *(xml_allocator **)((long)sa - (sa->header >> 8))) {
    alloc = pxVar1;
  }
  (anonymous_namespace)::node_copy_string<char*,unsigned_long>
            (&da->name,&da->header,0x20,sa->name,&sa->header,alloc);
  (anonymous_namespace)::node_copy_string<char*,unsigned_long>
            (&da->value,&da->header,0x10,sa->value,&sa->header,alloc);
  return;
}

Assistant:

PUGI_IMPL_FN void node_copy_attribute(xml_attribute_struct* da, xml_attribute_struct* sa)
	{
		xml_allocator& alloc = get_allocator(da);
		xml_allocator* shared_alloc = (&alloc == &get_allocator(sa)) ? &alloc : NULL;

		node_copy_string(da->name, da->header, xml_memory_page_name_allocated_mask, sa->name, sa->header, shared_alloc);
		node_copy_string(da->value, da->header, xml_memory_page_value_allocated_mask, sa->value, sa->header, shared_alloc);
	}